

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O2

BrailleCanvas * __thiscall plot::BrailleCanvas::push(BrailleCanvas *this)

{
  forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_> *__i
  ;
  undefined8 uVar1;
  undefined8 uVar2;
  GenericPoint<long> local_28;
  
  __i = &this->available_layers_;
  if ((this->available_layers_).
      super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
      ._M_impl._M_head._M_next == (_Fwd_list_node_base *)0x0) {
    uVar1 = this->lines_;
    uVar2 = this->cols_;
    local_28.y._0_4_ = (int)uVar1;
    local_28.x = uVar2;
    local_28.y._4_4_ = (int)((ulong)uVar1 >> 0x20);
    std::forward_list<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>
    ::emplace_front<plot::GenericPoint<long>>
              ((forward_list<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>
                *)__i,&local_28);
  }
  std::forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
  ::splice_after(&this->stack_,(const_iterator)&this->stack_,__i,(const_iterator)__i);
  std::_Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
  ::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->blocks_,
             (_Vector_impl_data *)
             ((this->stack_).
              super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
              ._M_impl._M_head._M_next + 1));
  detail::braille::image_t::clear(&this->blocks_);
  return this;
}

Assistant:

BrailleCanvas& push() {
        if (available_layers_.empty())
            available_layers_.emplace_front(char_size());

        stack_.splice_after(stack_.before_begin(), available_layers_, available_layers_.before_begin());
        blocks_.swap(stack_.front());
        blocks_.clear();
        return *this;
    }